

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_pack_header(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  char *__assertion;
  ulong __n;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      iVar3 = nvp->nvp_type;
      sVar4 = strlen(nvp->nvp_name);
      if (0xfffe < sVar4) {
        __assert_fail("namesize > 0 && namesize <= (65535)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x14d,
                      "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      if (0x12 < *leftp) {
        __n = sVar4 + 1;
        sVar1 = nvp->nvp_datasize;
        sVar2 = nvp->nvp_nitems;
        *ptr = (uchar)iVar3;
        *(short *)(ptr + 1) = (short)__n;
        *(size_t *)(ptr + 3) = sVar1;
        *(size_t *)(ptr + 0xb) = sVar2;
        sVar1 = *leftp;
        *leftp = sVar1 - 0x13;
        if (__n <= sVar1 - 0x13) {
          memcpy(ptr + 0x13,nvp->nvp_name,__n);
          *leftp = *leftp - __n;
          return ptr + sVar4 + 0x14;
        }
        __assert_fail("*leftp >= namesize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x156,
                      "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      __assert_fail("*leftp >= sizeof(nvphdr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x151,
                    "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)"
                   );
    }
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x149,
                "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
}

Assistant:

unsigned char *
nvpair_pack_header(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	struct nvpair_header nvphdr;
	size_t namesize;

	NVPAIR_ASSERT(nvp);

	nvphdr.nvph_type = nvp->nvp_type;
	namesize = strlen(nvp->nvp_name) + 1;
	PJDLOG_ASSERT(namesize > 0 && namesize <= UINT16_MAX);
	nvphdr.nvph_namesize = namesize;
	nvphdr.nvph_datasize = nvp->nvp_datasize;
	nvphdr.nvph_nitems = nvp->nvp_nitems;
	PJDLOG_ASSERT(*leftp >= sizeof(nvphdr));
	memcpy(ptr, &nvphdr, sizeof(nvphdr));
	ptr += sizeof(nvphdr);
	*leftp -= sizeof(nvphdr);

	PJDLOG_ASSERT(*leftp >= namesize);
	memcpy(ptr, nvp->nvp_name, namesize);
	ptr += namesize;
	*leftp -= namesize;

	return (ptr);
}